

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArray.h
# Opt level: O2

void __thiscall
pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>>::
pushBack<pica::Particle<(pica::Dimension)3>>
          (ParticleArraySoA<pica::Particle<(pica::Dimension)3>> *this,
          Particle<(pica::Dimension)3> particle)

{
  int d;
  long lVar1;
  ParticleArraySoA<pica::Particle<(pica::Dimension)3>> *pPVar2;
  double local_70;
  double local_68 [4];
  double local_48 [4];
  
  local_48[2] = particle.position.z;
  local_48[0] = particle.position.x;
  local_48[1] = particle.position.y;
  pPVar2 = this;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    local_68[0] = local_48[lVar1];
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)pPVar2,local_68);
    pPVar2 = pPVar2 + 0x18;
  }
  local_68[2] = particle.p.z;
  local_68[0] = particle.p.x;
  local_68[1] = particle.p.y;
  pPVar2 = this + 0x48;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    local_70 = local_68[lVar1];
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)pPVar2,&local_70);
    pPVar2 = pPVar2 + 0x18;
  }
  local_70 = particle.factor;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            ((vector<double,_std::allocator<double>_> *)(this + 0x90),&local_70);
  local_70 = 1.0 / (1.0 / particle.invGamma);
  std::vector<double,_std::allocator<double>_>::emplace_back<double>
            ((vector<double,_std::allocator<double>_> *)(this + 0xa8),&local_70);
  local_70 = (double)CONCAT62(local_70._2_6_,particle.typeIndex);
  std::vector<short,_std::allocator<short>_>::emplace_back<short>
            ((vector<short,_std::allocator<short>_> *)(this + 0xc0),(short *)&local_70);
  return;
}

Assistant:

void pushBack(ConstParticleRefType particle)
    {
        const typename ParticleRef::PositionType position = particle.getPosition();
        for (int d = 0; d < ParticleRef::dimension; d++)
            positions[d].push_back(position[d]);
        const typename ParticleRef::MomentumType p = particle.getP();
        for (int d = 0; d < ParticleRef::momentumDimension; d++)
            ps[d].push_back(p[d]);
        factors.push_back(particle.getFactor());
        invGammas.push_back(static_cast<typename ParticleRef::GammaType>(1.0) / particle.getGamma());
        typeIndex.push_back(particle.getType());
    }